

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_write(lua_State *L,FILE *fp,int start)

{
  uint uVar1;
  undefined4 *puVar2;
  bool bVar3;
  int iVar4;
  uint *fname;
  size_t sVar5;
  int in_EDX;
  FILE *in_RSI;
  long in_RDI;
  bool bVar6;
  MSize len;
  int status;
  cTValue *tv;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  int local_3c;
  
  bVar3 = true;
  fname = (uint *)(*(long *)(in_RDI + 0x10) + (long)in_EDX * 8);
  do {
    if (*(uint **)(in_RDI + 0x18) <= fname) {
      if (bVar3 == false) {
        local_3c = luaL_fileresult((lua_State *)in_RSI,in_EDX,(char *)fname);
      }
      else {
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 8;
        if (in_EDX == 0) {
          puVar2 = *(undefined4 **)(in_RDI + 0x10);
          *puVar2 = *(undefined4 *)((ulong)*(uint *)(in_RDI + 8) + 0x194);
          puVar2[1] = 0xfffffff3;
        }
        local_3c = 1;
      }
      return local_3c;
    }
    if (fname[1] == 0xfffffffb) {
      uVar1 = *(uint *)((ulong)*fname + 0xc);
      bVar6 = bVar3 != false;
      in_stack_ffffffffffffff97 = false;
      bVar3 = (bool)in_stack_ffffffffffffff97;
      if (bVar6) {
        sVar5 = fwrite((void *)((ulong)*fname + 0x10),1,(ulong)uVar1,in_RSI);
        in_stack_ffffffffffffff97 = sVar5 == uVar1;
        bVar3 = (bool)in_stack_ffffffffffffff97;
      }
    }
    else {
      if (0xfffefffe < fname[1]) {
        lj_err_argt((lua_State *)
                    CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                    in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      }
      bVar6 = bVar3 != false;
      in_stack_ffffffffffffff96 = false;
      bVar3 = (bool)in_stack_ffffffffffffff96;
      if (bVar6) {
        iVar4 = fprintf(in_RSI,"%.14g",*(undefined8 *)fname);
        in_stack_ffffffffffffff96 = 0 < iVar4;
        bVar3 = (bool)in_stack_ffffffffffffff96;
      }
    }
    fname = fname + 2;
  } while( true );
}

Assistant:

static int io_file_write(lua_State *L, FILE *fp, int start)
{
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    if (tvisstr(tv)) {
      MSize len = strV(tv)->len;
      status = status && (fwrite(strVdata(tv), 1, len, fp) == len);
    } else if (tvisint(tv)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(tv));
      size_t len = (size_t)(buf+LJ_STR_INTBUF-p);
      status = status && (fwrite(p, 1, len, fp) == len);
    } else if (tvisnum(tv)) {
      status = status && (fprintf(fp, LUA_NUMBER_FMT, numV(tv)) > 0);
    } else {
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    }
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}